

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O0

WalkResult __thiscall Map::Walk(Map *this,Character *from,Direction direction,bool admin)

{
  pointer *pppNVar1;
  pointer *this_00;
  pointer *this_01;
  byte bVar2;
  World *pWVar3;
  Character *pCVar4;
  NPC *pNVar5;
  size_t sVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  mapped_type *pmVar11;
  vector<NPC_*,_std::allocator<NPC_*>_> *pvVar12;
  list<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_> *plVar13;
  reference psVar14;
  reference pvVar15;
  reference ppCVar16;
  reference ppCVar17;
  size_type sVar18;
  reference psVar19;
  element_type *peVar20;
  reference ppNVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  allocator<char> local_471;
  int amount;
  double local_450;
  double spike_damage;
  NPC *pNStack_440;
  TileSpec spec;
  NPC *npc_1;
  iterator __end1_8;
  iterator __begin1_8;
  vector<NPC_*,_std::allocator<NPC_*>_> *__range1_8;
  NPC *npc;
  iterator __end1_7;
  iterator __begin1_7;
  vector<NPC_*,_std::allocator<NPC_*>_> *__range1_7;
  shared_ptr<Map_Item> item;
  iterator __end1_6;
  iterator __begin1_6;
  vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_> *__range1_6;
  Character *character_2;
  iterator __end1_5;
  iterator __begin1_5;
  list<Character_*,_std::allocator<Character_*>_> *__range1_5;
  string local_398;
  undefined1 local_378 [8];
  PacketBuilder rbuilder_1;
  Character *character_1;
  iterator __end1_4;
  iterator __begin1_4;
  vector<Character_*,_std::allocator<Character_*>_> *__range1_4;
  string local_308;
  undefined1 local_2e8 [8];
  PacketBuilder rbuilder;
  Character *character;
  iterator __end1_3;
  iterator __begin1_3;
  vector<Character_*,_std::allocator<Character_*>_> *__range1_3;
  PacketBuilder builder;
  size_t i_6;
  shared_ptr<Map_Item> checkitem;
  iterator __end1_2;
  iterator __begin1_2;
  list<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_> *__range1_2;
  size_t i_5;
  NPC *checknpc;
  iterator __end1_1;
  iterator __begin1_1;
  vector<NPC_*,_std::allocator<NPC_*>_> *__range1_1;
  size_t i_4;
  Character *checkchar;
  iterator __end1;
  iterator __begin1;
  list<Character_*,_std::allocator<Character_*>_> *__range1;
  pair<int,_int> local_1e0;
  int local_1d8;
  pair<int,_int> pStack_1d4;
  int i_3;
  pair<int,_int> local_1cc;
  int local_1c4;
  pair<int,_int> pStack_1c0;
  int i_2;
  pair<int,_int> local_1b8;
  int local_1b0;
  pair<int,_int> pStack_1ac;
  int i_1;
  pair<int,_int> local_1a4;
  int local_19c;
  undefined1 local_198 [4];
  int i;
  vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_> newitems;
  vector<NPC_*,_std::allocator<NPC_*>_> oldnpcs;
  vector<NPC_*,_std::allocator<NPC_*>_> newnpcs;
  vector<Character_*,_std::allocator<Character_*>_> oldchars;
  vector<Character_*,_std::allocator<Character_*>_> newchars;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> oldcoords;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> newcoords;
  int local_e8;
  int oldy;
  int oldx;
  int newy;
  int newx;
  string local_b8;
  Map *local_98;
  Map *map;
  Map_Warp *warp;
  key_type local_80;
  byte local_5e;
  byte local_5d;
  uchar target_y;
  uchar target_x;
  allocator<char> local_49;
  key_type local_48;
  int local_28;
  byte local_22;
  Direction local_21;
  int seedistance;
  bool admin_local;
  Direction direction_local;
  Character *from_local;
  Map *this_local;
  
  pWVar3 = this->world;
  local_22 = admin;
  local_21 = direction;
  _seedistance = from;
  from_local = (Character *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"SeeDistance",&local_49);
  pmVar11 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
            ::operator[](&(pWVar3->config).
                          super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                         ,&local_48);
  iVar9 = util::variant::operator_cast_to_int(pmVar11);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  local_5d = _seedistance->x;
  local_5e = _seedistance->y;
  switch(local_21) {
  case DIRECTION_DOWN:
    local_5e = local_5e + 1;
    if (local_5d < _seedistance->x) {
      return WalkFail;
    }
    break;
  case DIRECTION_LEFT:
    local_5d = local_5d - 1;
    if (_seedistance->x < local_5d) {
      return WalkFail;
    }
    break;
  case DIRECTION_UP:
    local_5e = local_5e - 1;
    if (_seedistance->y < local_5e) {
      return WalkFail;
    }
    break;
  case DIRECTION_RIGHT:
    local_5d = local_5d + 1;
    if (local_5d < _seedistance->x) {
      return WalkFail;
    }
  }
  local_28 = iVar9;
  bVar7 = InBounds(this,local_5d,local_5e);
  if (!bVar7) {
    return WalkFail;
  }
  if ((local_22 & 1) == 0) {
    bVar7 = Walkable(this,local_5d,local_5e,false);
    if (!bVar7) {
      return WalkFail;
    }
    bVar8 = Occupied(this,local_5d,local_5e,PlayerOnly,false);
    warp._6_1_ = 0;
    warp._5_1_ = 0;
    bVar7 = false;
    if (bVar8) {
      dVar24 = _seedistance->last_walk;
      pWVar3 = this->world;
      std::allocator<char>::allocator();
      warp._6_1_ = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_80,"GhostTimer",(allocator<char> *)((long)&warp + 7));
      warp._5_1_ = 1;
      pmVar11 = std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                ::operator[](&(pWVar3->config).
                              super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                             ,&local_80);
      dVar22 = util::variant::operator_cast_to_double(pmVar11);
      dVar23 = Timer::GetTime();
      bVar7 = dVar23 < dVar24 + dVar22;
    }
    if ((warp._5_1_ & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_80);
    }
    if ((warp._6_1_ & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)((long)&warp + 7));
    }
    if (bVar7) {
      return WalkFail;
    }
  }
  map = (Map *)GetWarp(this,local_5d,local_5e);
  bVar7 = Map_Warp::operator_cast_to_bool((Map_Warp *)map);
  if (bVar7) {
    if ((*(byte *)((long)&map->world + 4) <= _seedistance->level) &&
       ((iVar9._0_2_ = map->id, iVar9._2_1_ = map->rid[0], iVar9._3_1_ = map->rid[1], iVar9 == 0 ||
        ((map->rid[2] & 1U) != 0)))) {
      local_98 = World::GetMap(this->world,*(short *)&map->world);
      uVar10 = (**(_seedistance->super_Command_Source)._vptr_Command_Source)();
      pCVar4 = _seedistance;
      if (((uVar10 & 0xff) == 0) &&
         (((local_98->evacuate_lock & 1U) != 0 && (local_98->id != _seedistance->map->id)))) {
        pWVar3 = this->world;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&newx,"map_evacuate_block",(allocator<char> *)((long)&newy + 3));
        I18N::Format<>(&local_b8,&pWVar3->i18n,(string *)&newx);
        (*(pCVar4->super_Command_Source)._vptr_Command_Source[6])(pCVar4,&local_b8);
        std::__cxx11::string::~string((string *)&local_b8);
        std::__cxx11::string::~string((string *)&newx);
        std::allocator<char>::~allocator((allocator<char> *)((long)&newy + 3));
        Character::Refresh(_seedistance);
      }
      else {
        Character::Warp(_seedistance,*(short *)&map->world,*(uchar *)((long)&map->world + 2),
                        *(uchar *)((long)&map->world + 3),WARP_ANIMATION_NONE);
      }
      return WalkWarped;
    }
    if ((local_22 & 1) == 0) {
      return WalkFail;
    }
  }
  dVar24 = Timer::GetTime();
  _seedistance->last_walk = dVar24;
  _seedistance->attacks = 0;
  Character::CancelSpell(_seedistance);
  _seedistance->direction = local_21;
  _seedistance->x = local_5d;
  _seedistance->y = local_5e;
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
             &oldcoords.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
             &newchars.super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<Character_*,_std::allocator<Character_*>_>::vector
            ((vector<Character_*,_std::allocator<Character_*>_> *)
             &oldchars.super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<Character_*,_std::allocator<Character_*>_>::vector
            ((vector<Character_*,_std::allocator<Character_*>_> *)
             &newnpcs.super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<NPC_*,_std::allocator<NPC_*>_>::vector
            ((vector<NPC_*,_std::allocator<NPC_*>_> *)
             &oldnpcs.super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<NPC_*,_std::allocator<NPC_*>_>::vector
            ((vector<NPC_*,_std::allocator<NPC_*>_> *)
             &newitems.
              super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>::vector
            ((vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_> *)
             local_198);
  switch(local_21) {
  case DIRECTION_DOWN:
    for (local_1c4 = -local_28; local_1c4 <= local_28; local_1c4 = local_1c4 + 1) {
      iVar9 = -local_1c4;
      if (local_1c4 < 1) {
        iVar9 = local_1c4;
      }
      oldy = (uint)_seedistance->y + local_28 + iVar9;
      oldx = (uint)_seedistance->x + local_1c4;
      iVar9 = local_1c4;
      if (local_1c4 < 1) {
        iVar9 = -local_1c4;
      }
      newcoords.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
           ((uint)_seedistance->y - local_28) + -1 + iVar9;
      local_e8 = (uint)_seedistance->x + local_1c4;
      local_1cc = std::make_pair<int&,int&>(&oldx,&oldy);
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
                ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                 &oldcoords.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,&local_1cc);
      pStack_1d4 = std::make_pair<int&,int&>
                             (&local_e8,
                              (int *)((long)&newcoords.
                                             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 4)
                             );
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
                ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                 &newchars.super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&stack0xfffffffffffffe2c);
    }
    break;
  case DIRECTION_LEFT:
    for (local_1d8 = -local_28; local_1d8 <= local_28; local_1d8 = local_1d8 + 1) {
      iVar9 = local_1d8;
      if (local_1d8 < 1) {
        iVar9 = -local_1d8;
      }
      oldx = ((uint)_seedistance->x - local_28) + iVar9;
      oldy = (uint)_seedistance->y + local_1d8;
      iVar9 = -local_1d8;
      if (local_1d8 < 1) {
        iVar9 = local_1d8;
      }
      local_e8 = iVar9 + 1 + (uint)_seedistance->x + local_28;
      newcoords.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = (uint)_seedistance->y + local_1d8;
      local_1e0 = std::make_pair<int&,int&>(&oldx,&oldy);
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
                ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                 &oldcoords.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,&local_1e0);
      __range1 = (list<Character_*,_std::allocator<Character_*>_> *)
                 std::make_pair<int&,int&>
                           (&local_e8,
                            (int *)((long)&newcoords.
                                           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
                ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                 &newchars.super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(value_type *)&__range1);
    }
    break;
  case DIRECTION_UP:
    for (local_19c = -local_28; local_19c <= local_28; local_19c = local_19c + 1) {
      iVar9 = local_19c;
      if (local_19c < 1) {
        iVar9 = -local_19c;
      }
      oldy = ((uint)_seedistance->y - local_28) + iVar9;
      oldx = (uint)_seedistance->x + local_19c;
      iVar9 = -local_19c;
      if (local_19c < 1) {
        iVar9 = local_19c;
      }
      newcoords.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
           iVar9 + 1 + (uint)_seedistance->y + local_28;
      local_e8 = (uint)_seedistance->x + local_19c;
      local_1a4 = std::make_pair<int&,int&>(&oldx,&oldy);
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
                ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                 &oldcoords.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,&local_1a4);
      pStack_1ac = std::make_pair<int&,int&>
                             (&local_e8,
                              (int *)((long)&newcoords.
                                             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 4)
                             );
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
                ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                 &newchars.super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&stack0xfffffffffffffe54);
    }
    break;
  case DIRECTION_RIGHT:
    for (local_1b0 = -local_28; local_1b0 <= local_28; local_1b0 = local_1b0 + 1) {
      iVar9 = -local_1b0;
      if (local_1b0 < 1) {
        iVar9 = local_1b0;
      }
      oldx = (uint)_seedistance->x + local_28 + iVar9;
      oldy = (uint)_seedistance->y + local_1b0;
      local_e8 = local_1b0;
      if (local_1b0 < 1) {
        local_e8 = -local_1b0;
      }
      local_e8 = ((uint)_seedistance->x - local_28) + -1 + local_e8;
      newcoords.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = (uint)_seedistance->y + local_1b0;
      local_1b8 = std::make_pair<int&,int&>(&oldx,&oldy);
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
                ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                 &oldcoords.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,&local_1b8);
      pStack_1c0 = std::make_pair<int&,int&>
                             (&local_e8,
                              (int *)((long)&newcoords.
                                             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 4)
                             );
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
                ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                 &newchars.super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&stack0xfffffffffffffe40);
    }
  }
  __end1 = std::__cxx11::list<Character_*,_std::allocator<Character_*>_>::begin(&this->characters);
  checkchar = (Character *)
              std::__cxx11::list<Character_*,_std::allocator<Character_*>_>::end(&this->characters);
  while (bVar7 = std::operator!=(&__end1,(_Self *)&checkchar), bVar7) {
    ppCVar17 = std::_List_iterator<Character_*>::operator*(&__end1);
    i_4 = (size_t)*ppCVar17;
    if ((Character *)i_4 != _seedistance) {
      for (__range1_1 = (vector<NPC_*,_std::allocator<NPC_*>_> *)0x0;
          pvVar12 = (vector<NPC_*,_std::allocator<NPC_*>_> *)
                    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *
                               )&newchars.
                                 super__Vector_base<Character_*,_std::allocator<Character_*>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage),
          __range1_1 < pvVar12;
          __range1_1 = (vector<NPC_*,_std::allocator<NPC_*>_> *)
                       ((long)&(__range1_1->super__Vector_base<NPC_*,_std::allocator<NPC_*>_>).
                               _M_impl.super__Vector_impl_data._M_start + 1)) {
        bVar2 = *(byte *)(i_4 + 0xc0);
        pvVar15 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
                  operator[]((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                             &newchars.super__Vector_base<Character_*,_std::allocator<Character_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             (size_type)__range1_1);
        if (((uint)bVar2 == pvVar15->first) &&
           (bVar2 = *(byte *)(i_4 + 0xc1),
           pvVar15 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
                     operator[]((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                 *)&newchars.
                                    super__Vector_base<Character_*,_std::allocator<Character_*>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage,
                                (size_type)__range1_1), (uint)bVar2 == pvVar15->second)) {
          std::vector<Character_*,_std::allocator<Character_*>_>::push_back
                    ((vector<Character_*,_std::allocator<Character_*>_> *)
                     &newnpcs.super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,(value_type *)&i_4);
        }
        else {
          bVar2 = *(byte *)(i_4 + 0xc0);
          pvVar15 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
                    operator[]((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *
                               )&oldcoords.
                                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (size_type)__range1_1);
          if (((uint)bVar2 == pvVar15->first) &&
             (bVar2 = *(byte *)(i_4 + 0xc1),
             pvVar15 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
                       operator[]((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                   *)&oldcoords.
                                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                  (size_type)__range1_1), (uint)bVar2 == pvVar15->second)) {
            std::vector<Character_*,_std::allocator<Character_*>_>::push_back
                      ((vector<Character_*,_std::allocator<Character_*>_> *)
                       &oldchars.super__Vector_base<Character_*,_std::allocator<Character_*>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)&i_4);
          }
        }
      }
    }
    std::_List_iterator<Character_*>::operator++(&__end1);
  }
  __end1_1 = std::vector<NPC_*,_std::allocator<NPC_*>_>::begin(&this->npcs);
  checknpc = (NPC *)std::vector<NPC_*,_std::allocator<NPC_*>_>::end(&this->npcs);
  while (bVar7 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<NPC_**,_std::vector<NPC_*,_std::allocator<NPC_*>_>_>
                             *)&checknpc), bVar7) {
    ppNVar21 = __gnu_cxx::__normal_iterator<NPC_**,_std::vector<NPC_*,_std::allocator<NPC_*>_>_>::
               operator*(&__end1_1);
    i_5 = (size_t)*ppNVar21;
    if ((((NPC *)i_5)->alive & 1U) != 0) {
      for (__range1_2 = (list<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
                         *)0x0;
          plVar13 = (list<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_> *)
                    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *
                               )&newchars.
                                 super__Vector_base<Character_*,_std::allocator<Character_*>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage),
          __range1_2 < plVar13;
          __range1_2 = (list<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
                        *)((long)&(__range1_2->
                                  super__List_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
                                  )._M_impl._M_node.super__List_node_base._M_next + 1)) {
        bVar2 = *(byte *)(i_5 + 2);
        pvVar15 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
                  operator[]((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                             &newchars.super__Vector_base<Character_*,_std::allocator<Character_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             (size_type)__range1_2);
        if (((uint)bVar2 == pvVar15->first) &&
           (bVar2 = *(byte *)(i_5 + 3),
           pvVar15 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
                     operator[]((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                 *)&newchars.
                                    super__Vector_base<Character_*,_std::allocator<Character_*>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage,
                                (size_type)__range1_2), (uint)bVar2 == pvVar15->second)) {
          std::vector<NPC_*,_std::allocator<NPC_*>_>::push_back
                    ((vector<NPC_*,_std::allocator<NPC_*>_> *)
                     &newitems.
                      super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)&i_5);
        }
        else {
          bVar2 = *(byte *)(i_5 + 2);
          pvVar15 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
                    operator[]((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *
                               )&oldcoords.
                                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (size_type)__range1_2);
          if (((uint)bVar2 == pvVar15->first) &&
             (bVar2 = *(byte *)(i_5 + 3),
             pvVar15 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
                       operator[]((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                   *)&oldcoords.
                                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                  (size_type)__range1_2), (uint)bVar2 == pvVar15->second)) {
            std::vector<NPC_*,_std::allocator<NPC_*>_>::push_back
                      ((vector<NPC_*,_std::allocator<NPC_*>_> *)
                       &oldnpcs.super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,(value_type *)&i_5);
          }
        }
      }
    }
    __gnu_cxx::__normal_iterator<NPC_**,_std::vector<NPC_*,_std::allocator<NPC_*>_>_>::operator++
              (&__end1_1);
  }
  __end1_2 = std::__cxx11::
             list<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>::begin
                       (&this->items);
  checkitem.super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::__cxx11::list<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>::
       end(&this->items);
  while (bVar7 = std::operator!=(&__end1_2,
                                 (_Self *)&checkitem.
                                           super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>.
                                           _M_refcount), bVar7) {
    psVar14 = std::_List_iterator<std::shared_ptr<Map_Item>_>::operator*(&__end1_2);
    std::shared_ptr<Map_Item>::shared_ptr((shared_ptr<Map_Item> *)&i_6,psVar14);
    for (builder.add_size = 0; sVar6 = builder.add_size,
        sVar18 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                           ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                            &newchars.super__Vector_base<Character_*,_std::allocator<Character_*>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage), sVar6 < sVar18;
        builder.add_size = builder.add_size + 1) {
      peVar20 = std::__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&i_6);
      bVar2 = peVar20->x;
      pvVar15 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                          ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                           &oldcoords.
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,builder.add_size);
      if ((uint)bVar2 == pvVar15->first) {
        peVar20 = std::__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&i_6);
        bVar2 = peVar20->y;
        pvVar15 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
                  operator[]((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                             &oldcoords.
                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,builder.add_size);
        if ((uint)bVar2 == pvVar15->second) {
          std::vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>::
          push_back((vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
                     *)local_198,(value_type *)&i_6);
        }
      }
    }
    std::shared_ptr<Map_Item>::~shared_ptr((shared_ptr<Map_Item> *)&i_6);
    std::_List_iterator<std::shared_ptr<Map_Item>_>::operator++(&__end1_2);
  }
  PacketBuilder::PacketBuilder((PacketBuilder *)&__range1_3,PACKET_AVATAR,PACKET_REMOVE,2);
  iVar9 = Character::PlayerID(_seedistance);
  PacketBuilder::AddShort((PacketBuilder *)&__range1_3,iVar9);
  pppNVar1 = &newnpcs.super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  __end1_3 = std::vector<Character_*,_std::allocator<Character_*>_>::begin
                       ((vector<Character_*,_std::allocator<Character_*>_> *)pppNVar1);
  character = (Character *)
              std::vector<Character_*,_std::allocator<Character_*>_>::end
                        ((vector<Character_*,_std::allocator<Character_*>_> *)pppNVar1);
  while (bVar7 = __gnu_cxx::operator!=
                           (&__end1_3,
                            (__normal_iterator<Character_**,_std::vector<Character_*,_std::allocator<Character_*>_>_>
                             *)&character), bVar7) {
    ppCVar16 = __gnu_cxx::
               __normal_iterator<Character_**,_std::vector<Character_*,_std::allocator<Character_*>_>_>
               ::operator*(&__end1_3);
    rbuilder.add_size = (size_t)*ppCVar16;
    PacketBuilder::PacketBuilder((PacketBuilder *)local_2e8,PACKET_AVATAR,PACKET_REMOVE,2);
    iVar9 = Character::PlayerID((Character *)rbuilder.add_size);
    PacketBuilder::AddShort((PacketBuilder *)local_2e8,iVar9);
    Character::Send((Character *)rbuilder.add_size,(PacketBuilder *)&__range1_3);
    Character::Send(_seedistance,(PacketBuilder *)local_2e8);
    PacketBuilder::~PacketBuilder((PacketBuilder *)local_2e8);
    __gnu_cxx::
    __normal_iterator<Character_**,_std::vector<Character_*,_std::allocator<Character_*>_>_>::
    operator++(&__end1_3);
  }
  PacketBuilder::Reset((PacketBuilder *)&__range1_3,0x3e);
  PacketBuilder::SetID((PacketBuilder *)&__range1_3,PACKET_PLAYERS,PACKET_AGREE);
  PacketBuilder::AddByte((PacketBuilder *)&__range1_3,0xff);
  (*(_seedistance->super_Command_Source)._vptr_Command_Source[2])(&local_308);
  PacketBuilder::AddBreakString((PacketBuilder *)&__range1_3,&local_308,0xff);
  std::__cxx11::string::~string((string *)&local_308);
  iVar9 = Character::PlayerID(_seedistance);
  PacketBuilder::AddShort((PacketBuilder *)&__range1_3,iVar9);
  PacketBuilder::AddShort((PacketBuilder *)&__range1_3,(int)_seedistance->mapid);
  PacketBuilder::AddShort((PacketBuilder *)&__range1_3,(uint)_seedistance->x);
  PacketBuilder::AddShort((PacketBuilder *)&__range1_3,(uint)_seedistance->y);
  PacketBuilder::AddChar((PacketBuilder *)&__range1_3,(uint)_seedistance->direction);
  PacketBuilder::AddChar((PacketBuilder *)&__range1_3,6);
  Character::PaddedGuildTag_abi_cxx11_((string *)&__range1_4,_seedistance);
  PacketBuilder::AddString((PacketBuilder *)&__range1_3,(string *)&__range1_4);
  std::__cxx11::string::~string((string *)&__range1_4);
  PacketBuilder::AddChar((PacketBuilder *)&__range1_3,(uint)_seedistance->level);
  PacketBuilder::AddChar((PacketBuilder *)&__range1_3,(uint)_seedistance->gender);
  PacketBuilder::AddChar((PacketBuilder *)&__range1_3,(uint)_seedistance->hairstyle);
  PacketBuilder::AddChar((PacketBuilder *)&__range1_3,(uint)_seedistance->haircolor);
  PacketBuilder::AddChar((PacketBuilder *)&__range1_3,(uint)_seedistance->race);
  PacketBuilder::AddShort((PacketBuilder *)&__range1_3,_seedistance->maxhp);
  PacketBuilder::AddShort((PacketBuilder *)&__range1_3,_seedistance->hp);
  PacketBuilder::AddShort((PacketBuilder *)&__range1_3,_seedistance->maxtp);
  PacketBuilder::AddShort((PacketBuilder *)&__range1_3,_seedistance->tp);
  Character::AddPaperdollData(_seedistance,(PacketBuilder *)&__range1_3,"B000A0HSW");
  PacketBuilder::AddChar((PacketBuilder *)&__range1_3,(uint)_seedistance->sitting);
  bVar7 = Character::IsHideInvisible(_seedistance);
  PacketBuilder::AddChar((PacketBuilder *)&__range1_3,(uint)bVar7);
  PacketBuilder::AddByte((PacketBuilder *)&__range1_3,0xff);
  PacketBuilder::AddChar((PacketBuilder *)&__range1_3,1);
  this_00 = &oldchars.super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  __end1_4 = std::vector<Character_*,_std::allocator<Character_*>_>::begin
                       ((vector<Character_*,_std::allocator<Character_*>_> *)this_00);
  character_1 = (Character *)
                std::vector<Character_*,_std::allocator<Character_*>_>::end
                          ((vector<Character_*,_std::allocator<Character_*>_> *)this_00);
  while (bVar7 = __gnu_cxx::operator!=
                           (&__end1_4,
                            (__normal_iterator<Character_**,_std::vector<Character_*,_std::allocator<Character_*>_>_>
                             *)&character_1), bVar7) {
    ppCVar16 = __gnu_cxx::
               __normal_iterator<Character_**,_std::vector<Character_*,_std::allocator<Character_*>_>_>
               ::operator*(&__end1_4);
    rbuilder_1.add_size = (size_t)*ppCVar16;
    PacketBuilder::PacketBuilder((PacketBuilder *)local_378,PACKET_PLAYERS,PACKET_AGREE,0x3e);
    PacketBuilder::AddByte((PacketBuilder *)local_378,0xff);
    (**(code **)(*(long *)rbuilder_1.add_size + 0x10))(&local_398);
    PacketBuilder::AddBreakString((PacketBuilder *)local_378,&local_398,0xff);
    std::__cxx11::string::~string((string *)&local_398);
    iVar9 = Character::PlayerID((Character *)rbuilder_1.add_size);
    PacketBuilder::AddShort((PacketBuilder *)local_378,iVar9);
    PacketBuilder::AddShort((PacketBuilder *)local_378,(int)*(short *)(rbuilder_1.add_size + 0xbe));
    PacketBuilder::AddShort((PacketBuilder *)local_378,(uint)*(byte *)(rbuilder_1.add_size + 0xc0));
    PacketBuilder::AddShort((PacketBuilder *)local_378,(uint)*(byte *)(rbuilder_1.add_size + 0xc1));
    PacketBuilder::AddChar((PacketBuilder *)local_378,(uint)*(byte *)(rbuilder_1.add_size + 0xc2));
    PacketBuilder::AddChar((PacketBuilder *)local_378,6);
    Character::PaddedGuildTag_abi_cxx11_((string *)&__range1_5,(Character *)rbuilder_1.add_size);
    PacketBuilder::AddString((PacketBuilder *)local_378,(string *)&__range1_5);
    std::__cxx11::string::~string((string *)&__range1_5);
    PacketBuilder::AddChar((PacketBuilder *)local_378,(uint)*(byte *)(rbuilder_1.add_size + 0xc3));
    PacketBuilder::AddChar((PacketBuilder *)local_378,(uint)*(byte *)(rbuilder_1.add_size + 0xb9));
    PacketBuilder::AddChar((PacketBuilder *)local_378,(uint)*(byte *)(rbuilder_1.add_size + 0xbb));
    PacketBuilder::AddChar((PacketBuilder *)local_378,(uint)*(byte *)(rbuilder_1.add_size + 0xbc));
    PacketBuilder::AddChar((PacketBuilder *)local_378,(uint)*(byte *)(rbuilder_1.add_size + 0xba));
    PacketBuilder::AddShort((PacketBuilder *)local_378,*(int *)(rbuilder_1.add_size + 0x170));
    PacketBuilder::AddShort((PacketBuilder *)local_378,*(int *)(rbuilder_1.add_size + 200));
    PacketBuilder::AddShort((PacketBuilder *)local_378,*(int *)(rbuilder_1.add_size + 0x174));
    PacketBuilder::AddShort((PacketBuilder *)local_378,*(int *)(rbuilder_1.add_size + 0xcc));
    Character::AddPaperdollData
              ((Character *)rbuilder_1.add_size,(PacketBuilder *)local_378,"B000A0HSW");
    PacketBuilder::AddChar((PacketBuilder *)local_378,(uint)*(byte *)(rbuilder_1.add_size + 0x114));
    bVar7 = Character::IsHideInvisible((Character *)rbuilder_1.add_size);
    PacketBuilder::AddChar((PacketBuilder *)local_378,(uint)bVar7);
    PacketBuilder::AddByte((PacketBuilder *)local_378,0xff);
    PacketBuilder::AddChar((PacketBuilder *)local_378,1);
    Character::Send((Character *)rbuilder_1.add_size,(PacketBuilder *)&__range1_3);
    Character::Send(_seedistance,(PacketBuilder *)local_378);
    PacketBuilder::~PacketBuilder((PacketBuilder *)local_378);
    __gnu_cxx::
    __normal_iterator<Character_**,_std::vector<Character_*,_std::allocator<Character_*>_>_>::
    operator++(&__end1_4);
  }
  PacketBuilder::Reset((PacketBuilder *)&__range1_3,5);
  PacketBuilder::SetID((PacketBuilder *)&__range1_3,PACKET_WALK,PACKET_PLAYER);
  iVar9 = Character::PlayerID(_seedistance);
  PacketBuilder::AddShort((PacketBuilder *)&__range1_3,iVar9);
  PacketBuilder::AddChar((PacketBuilder *)&__range1_3,(uint)local_21);
  PacketBuilder::AddChar((PacketBuilder *)&__range1_3,(uint)_seedistance->x);
  PacketBuilder::AddChar((PacketBuilder *)&__range1_3,(uint)_seedistance->y);
  __end1_5 = std::__cxx11::list<Character_*,_std::allocator<Character_*>_>::begin(&this->characters)
  ;
  character_2 = (Character *)
                std::__cxx11::list<Character_*,_std::allocator<Character_*>_>::end
                          (&this->characters);
  while (bVar7 = std::operator!=(&__end1_5,(_Self *)&character_2), bVar7) {
    ppCVar17 = std::_List_iterator<Character_*>::operator*(&__end1_5);
    pCVar4 = *ppCVar17;
    if ((pCVar4 != _seedistance) && (bVar7 = Character::InRange(_seedistance,pCVar4), bVar7)) {
      Character::Send(pCVar4,(PacketBuilder *)&__range1_3);
    }
    std::_List_iterator<Character_*>::operator++(&__end1_5);
  }
  sVar18 = std::vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>::size
                     ((vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
                       *)local_198);
  PacketBuilder::Reset((PacketBuilder *)&__range1_3,sVar18 * 9 + 2);
  PacketBuilder::SetID((PacketBuilder *)&__range1_3,PACKET_WALK,PACKET_REPLY);
  PacketBuilder::AddByte((PacketBuilder *)&__range1_3,0xff);
  PacketBuilder::AddByte((PacketBuilder *)&__range1_3,0xff);
  __end1_6 = std::vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>::
             begin((vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_> *
                   )local_198);
  item.super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>::end
                 ((vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_> *)
                  local_198);
  while (bVar7 = __gnu_cxx::operator!=
                           (&__end1_6,
                            (__normal_iterator<std::shared_ptr<Map_Item>_*,_std::vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>_>
                             *)&item.super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount), bVar7) {
    psVar19 = __gnu_cxx::
              __normal_iterator<std::shared_ptr<Map_Item>_*,_std::vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>_>
              ::operator*(&__end1_6);
    std::shared_ptr<Map_Item>::shared_ptr((shared_ptr<Map_Item> *)&__range1_7,psVar19);
    peVar20 = std::__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                         &__range1_7);
    PacketBuilder::AddShort((PacketBuilder *)&__range1_3,(int)peVar20->uid);
    peVar20 = std::__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                         &__range1_7);
    PacketBuilder::AddShort((PacketBuilder *)&__range1_3,(int)peVar20->id);
    peVar20 = std::__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                         &__range1_7);
    PacketBuilder::AddChar((PacketBuilder *)&__range1_3,(uint)peVar20->x);
    peVar20 = std::__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                         &__range1_7);
    PacketBuilder::AddChar((PacketBuilder *)&__range1_3,(uint)peVar20->y);
    peVar20 = std::__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<Map_Item,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                         &__range1_7);
    PacketBuilder::AddThree((PacketBuilder *)&__range1_3,peVar20->amount);
    std::shared_ptr<Map_Item>::~shared_ptr((shared_ptr<Map_Item> *)&__range1_7);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<Map_Item>_*,_std::vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>_>
    ::operator++(&__end1_6);
  }
  Character::Send(_seedistance,(PacketBuilder *)&__range1_3);
  PacketBuilder::SetID((PacketBuilder *)&__range1_3,PACKET_RANGE,PACKET_REPLY);
  pppNVar1 = &oldnpcs.super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  __end1_7 = std::vector<NPC_*,_std::allocator<NPC_*>_>::begin
                       ((vector<NPC_*,_std::allocator<NPC_*>_> *)pppNVar1);
  npc = (NPC *)std::vector<NPC_*,_std::allocator<NPC_*>_>::end
                         ((vector<NPC_*,_std::allocator<NPC_*>_> *)pppNVar1);
  while (bVar7 = __gnu_cxx::operator!=
                           (&__end1_7,
                            (__normal_iterator<NPC_**,_std::vector<NPC_*,_std::allocator<NPC_*>_>_>
                             *)&npc), bVar7) {
    ppNVar21 = __gnu_cxx::__normal_iterator<NPC_**,_std::vector<NPC_*,_std::allocator<NPC_*>_>_>::
               operator*(&__end1_7);
    pNVar5 = *ppNVar21;
    PacketBuilder::Reset((PacketBuilder *)&__range1_3,8);
    PacketBuilder::AddChar((PacketBuilder *)&__range1_3,0);
    PacketBuilder::AddByte((PacketBuilder *)&__range1_3,0xff);
    PacketBuilder::AddChar((PacketBuilder *)&__range1_3,(uint)pNVar5->index);
    PacketBuilder::AddShort((PacketBuilder *)&__range1_3,pNVar5->id);
    PacketBuilder::AddChar((PacketBuilder *)&__range1_3,(uint)pNVar5->x);
    PacketBuilder::AddChar((PacketBuilder *)&__range1_3,(uint)pNVar5->y);
    PacketBuilder::AddChar((PacketBuilder *)&__range1_3,(uint)pNVar5->direction);
    Character::Send(_seedistance,(PacketBuilder *)&__range1_3);
    __gnu_cxx::__normal_iterator<NPC_**,_std::vector<NPC_*,_std::allocator<NPC_*>_>_>::operator++
              (&__end1_7);
  }
  this_01 = &newitems.
             super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  __end1_8 = std::vector<NPC_*,_std::allocator<NPC_*>_>::begin
                       ((vector<NPC_*,_std::allocator<NPC_*>_> *)this_01);
  npc_1 = (NPC *)std::vector<NPC_*,_std::allocator<NPC_*>_>::end
                           ((vector<NPC_*,_std::allocator<NPC_*>_> *)this_01);
  while (bVar7 = __gnu_cxx::operator!=
                           (&__end1_8,
                            (__normal_iterator<NPC_**,_std::vector<NPC_*,_std::allocator<NPC_*>_>_>
                             *)&npc_1), bVar7) {
    ppNVar21 = __gnu_cxx::__normal_iterator<NPC_**,_std::vector<NPC_*,_std::allocator<NPC_*>_>_>::
               operator*(&__end1_8);
    pNStack_440 = *ppNVar21;
    NPC::RemoveFromView(pNStack_440,_seedistance);
    __gnu_cxx::__normal_iterator<NPC_**,_std::vector<NPC_*,_std::allocator<NPC_*>_>_>::operator++
              (&__end1_8);
  }
  Character::CheckQuestRules(_seedistance);
  spike_damage._4_4_ = GetSpec(this,_seedistance->x,_seedistance->y);
  pWVar3 = this->world;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&amount,"SpikeDamage",&local_471);
  pmVar11 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
            ::operator[](&(pWVar3->config).
                          super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                         ,(key_type *)&amount);
  dVar24 = util::variant::operator_cast_to_double(pmVar11);
  std::__cxx11::string::~string((string *)&amount);
  std::allocator<char>::~allocator(&local_471);
  local_450 = dVar24;
  if (((dVar24 <= 0.0) ||
      (((spike_damage._4_4_ != Spikes2 && (spike_damage._4_4_ != Spikes3)) ||
       (bVar7 = Character::IsHideInvisible(_seedistance), bVar7)))) ||
     (Character::SpikeDamage(_seedistance,(int)((double)_seedistance->maxhp * local_450)),
     _seedistance->hp != 0)) {
    this_local._4_4_ = WalkOK;
  }
  else {
    Character::DeathRespawn(_seedistance);
    this_local._4_4_ = WalkWarped;
  }
  PacketBuilder::~PacketBuilder((PacketBuilder *)&__range1_3);
  std::vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>::~vector
            ((vector<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_> *)
             local_198);
  std::vector<NPC_*,_std::allocator<NPC_*>_>::~vector
            ((vector<NPC_*,_std::allocator<NPC_*>_> *)
             &newitems.
              super__Vector_base<std::shared_ptr<Map_Item>,_std::allocator<std::shared_ptr<Map_Item>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<NPC_*,_std::allocator<NPC_*>_>::~vector
            ((vector<NPC_*,_std::allocator<NPC_*>_> *)
             &oldnpcs.super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<Character_*,_std::allocator<Character_*>_>::~vector
            ((vector<Character_*,_std::allocator<Character_*>_> *)
             &newnpcs.super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<Character_*,_std::allocator<Character_*>_>::~vector
            ((vector<Character_*,_std::allocator<Character_*>_> *)
             &oldchars.super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
             &newchars.super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
             &oldcoords.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage);
  return this_local._4_4_;
}

Assistant:

Map::WalkResult Map::Walk(Character *from, Direction direction, bool admin)
{
	int seedistance = this->world->config["SeeDistance"];

	unsigned char target_x = from->x;
	unsigned char target_y = from->y;

	switch (direction)
	{
		case DIRECTION_UP:
			target_y -= 1;

			if (target_y > from->y)
			{
				return WalkFail;
			}

			break;

		case DIRECTION_RIGHT:
			target_x += 1;

			if (target_x < from->x)
			{
				return WalkFail;
			}

			break;

		case DIRECTION_DOWN:
			target_y += 1;

			if (target_x < from->x)
			{
				return WalkFail;
			}

			break;

		case DIRECTION_LEFT:
			target_x -= 1;

			if (target_x > from->x)
			{
				return WalkFail;
			}

			break;
	}

	if (!this->InBounds(target_x, target_y))
		return WalkFail;

	if (!admin)
	{
		if (!this->Walkable(target_x, target_y))
			return WalkFail;

		if (this->Occupied(target_x, target_y, PlayerOnly) && (from->last_walk + double(this->world->config["GhostTimer"]) > Timer::GetTime()))
			return WalkFail;
	}

	const Map_Warp& warp = this->GetWarp(target_x, target_y);

	if (warp)
	{
		if (from->level >= warp.levelreq && (warp.spec == Map_Warp::NoDoor || warp.open))
		{
			Map* map = this->world->GetMap(warp.map);
			if (from->SourceAccess() < ADMIN_GUIDE && map->evacuate_lock && map->id != from->map->id)
			{
				from->StatusMsg(this->world->i18n.Format("map_evacuate_block"));
				from->Refresh();
			}
			else
			{
				from->Warp(warp.map, warp.x, warp.y);
			}

			return WalkWarped;
		}

		if (!admin)
			return WalkFail;
	}

    from->last_walk = Timer::GetTime();
    from->attacks = 0;
    from->CancelSpell();

	from->direction = direction;

	from->x = target_x;
	from->y = target_y;

	int newx;
	int newy;
	int oldx;
	int oldy;

	std::vector<std::pair<int, int>> newcoords;
	std::vector<std::pair<int, int>> oldcoords;

	std::vector<Character *> newchars;
	std::vector<Character *> oldchars;
	std::vector<NPC *> newnpcs;
	std::vector<NPC *> oldnpcs;
	std::vector<std::shared_ptr<Map_Item>> newitems;

	switch (direction)
	{
		case DIRECTION_UP:
			for (int i = -seedistance; i <= seedistance; ++i)
			{
				newy = from->y - seedistance + std::abs(i);
				newx = from->x + i;
				oldy = from->y + seedistance + 1 - std::abs(i);
				oldx = from->x + i;

				newcoords.push_back(std::make_pair(newx, newy));
				oldcoords.push_back(std::make_pair(oldx, oldy));
			}
			break;

		case DIRECTION_RIGHT:
			for (int i = -seedistance; i <= seedistance; ++i)
			{
				newx = from->x + seedistance - std::abs(i);
				newy = from->y + i;
				oldx = from->x - seedistance - 1 + std::abs(i);
				oldy = from->y + i;

				newcoords.push_back(std::make_pair(newx, newy));
				oldcoords.push_back(std::make_pair(oldx, oldy));
			}
			break;

		case DIRECTION_DOWN:
			for (int i = -seedistance; i <= seedistance; ++i)
			{
				newy = from->y + seedistance - std::abs(i);
				newx = from->x + i;
				oldy = from->y - seedistance - 1 + std::abs(i);
				oldx = from->x + i;

				newcoords.push_back(std::make_pair(newx, newy));
				oldcoords.push_back(std::make_pair(oldx, oldy));
			}
			break;

		case DIRECTION_LEFT:
			for (int i = -seedistance; i <= seedistance; ++i)
			{
				newx = from->x - seedistance + std::abs(i);
				newy = from->y + i;
				oldx = from->x + seedistance + 1 - std::abs(i);
				oldy = from->y + i;

				newcoords.push_back(std::make_pair(newx, newy));
				oldcoords.push_back(std::make_pair(oldx, oldy));
			}
			break;

	}

	UTIL_FOREACH(this->characters, checkchar)
	{
		if (checkchar == from)
		{
			continue;
		}

		for (std::size_t i = 0; i < oldcoords.size(); ++i)
		{
			if (checkchar->x == oldcoords[i].first && checkchar->y == oldcoords[i].second)
			{
				oldchars.push_back(checkchar);
			}
			else if (checkchar->x == newcoords[i].first && checkchar->y == newcoords[i].second)
			{
				newchars.push_back(checkchar);
			}
		}
	}

	UTIL_FOREACH(this->npcs, checknpc)
	{
		if (!checknpc->alive)
		{
			continue;
		}

		for (std::size_t i = 0; i < oldcoords.size(); ++i)
		{
			if (checknpc->x == oldcoords[i].first && checknpc->y == oldcoords[i].second)
			{
				oldnpcs.push_back(checknpc);
			}
			else if (checknpc->x == newcoords[i].first && checknpc->y == newcoords[i].second)
			{
				newnpcs.push_back(checknpc);
			}
		}
	}

	UTIL_FOREACH(this->items, checkitem)
	{
		for (std::size_t i = 0; i < oldcoords.size(); ++i)
		{
			if (checkitem->x == newcoords[i].first && checkitem->y == newcoords[i].second)
			{
				newitems.push_back(checkitem);
			}
		}
	}

	PacketBuilder builder(PACKET_AVATAR, PACKET_REMOVE, 2);
	builder.AddShort(from->PlayerID());

	UTIL_FOREACH(oldchars, character)
	{
		PacketBuilder rbuilder(PACKET_AVATAR, PACKET_REMOVE, 2);
		rbuilder.AddShort(character->PlayerID());

		character->Send(builder);
		from->Send(rbuilder);
	}

	builder.Reset(62);
	builder.SetID(PACKET_PLAYERS, PACKET_AGREE);

	builder.AddByte(255);
	builder.AddBreakString(from->SourceName());
	builder.AddShort(from->PlayerID());
	builder.AddShort(from->mapid);
	builder.AddShort(from->x);
	builder.AddShort(from->y);
	builder.AddChar(from->direction);
	builder.AddChar(6); // ?
	builder.AddString(from->PaddedGuildTag());
	builder.AddChar(from->level);
	builder.AddChar(from->gender);
	builder.AddChar(from->hairstyle);
	builder.AddChar(from->haircolor);
	builder.AddChar(from->race);
	builder.AddShort(from->maxhp);
	builder.AddShort(from->hp);
	builder.AddShort(from->maxtp);
	builder.AddShort(from->tp);
	// equipment
	from->AddPaperdollData(builder, "B000A0HSW");
	builder.AddChar(from->sitting);
	builder.AddChar(from->IsHideInvisible());
	builder.AddByte(255);
	builder.AddChar(1); // 0 = NPC, 1 = player

	UTIL_FOREACH(newchars, character)
	{
		PacketBuilder rbuilder(PACKET_PLAYERS, PACKET_AGREE, 62);
		rbuilder.AddByte(255);
		rbuilder.AddBreakString(character->SourceName());
		rbuilder.AddShort(character->PlayerID());
		rbuilder.AddShort(character->mapid);
		rbuilder.AddShort(character->x);
		rbuilder.AddShort(character->y);
		rbuilder.AddChar(character->direction);
		rbuilder.AddChar(6); // ?
		rbuilder.AddString(character->PaddedGuildTag());
		rbuilder.AddChar(character->level);
		rbuilder.AddChar(character->gender);
		rbuilder.AddChar(character->hairstyle);
		rbuilder.AddChar(character->haircolor);
		rbuilder.AddChar(character->race);
		rbuilder.AddShort(character->maxhp);
		rbuilder.AddShort(character->hp);
		rbuilder.AddShort(character->maxtp);
		rbuilder.AddShort(character->tp);
		// equipment
		character->AddPaperdollData(rbuilder, "B000A0HSW");

		rbuilder.AddChar(character->sitting);
		rbuilder.AddChar(character->IsHideInvisible());
		rbuilder.AddByte(255);
		rbuilder.AddChar(1); // 0 = NPC, 1 = player

		character->Send(builder);
		from->Send(rbuilder);
	}

	builder.Reset(5);
	builder.SetID(PACKET_WALK, PACKET_PLAYER);

	builder.AddShort(from->PlayerID());
	builder.AddChar(direction);
	builder.AddChar(from->x);
	builder.AddChar(from->y);

	UTIL_FOREACH(this->characters, character)
	{
		if (character == from || !from->InRange(character))
		{
			continue;
		}

		character->Send(builder);
	}

	builder.Reset(2 + newitems.size() * 9);
	builder.SetID(PACKET_WALK, PACKET_REPLY);

	builder.AddByte(255);
	builder.AddByte(255);
	UTIL_FOREACH(newitems, item)
	{
		builder.AddShort(item->uid);
		builder.AddShort(item->id);
		builder.AddChar(item->x);
		builder.AddChar(item->y);
		builder.AddThree(item->amount);
	}
	from->Send(builder);

	builder.SetID(PACKET_RANGE, PACKET_REPLY);
	UTIL_FOREACH(newnpcs, npc)
	{
		builder.Reset(8);
		builder.AddChar(0);
		builder.AddByte(255);
		builder.AddChar(npc->index);
		builder.AddShort(npc->id);
		builder.AddChar(npc->x);
		builder.AddChar(npc->y);
		builder.AddChar(npc->direction);

		from->Send(builder);
	}

	UTIL_FOREACH(oldnpcs, npc)
	{
		npc->RemoveFromView(from);
	}

	from->CheckQuestRules();

	Map_Tile::TileSpec spec = this->GetSpec(from->x, from->y);

	double spike_damage = this->world->config["SpikeDamage"];

	if (spike_damage > 0.0 && (spec == Map_Tile::Spikes2 || spec == Map_Tile::Spikes3) && !from->IsHideInvisible())
	{
		int amount = from->maxhp * spike_damage;

		from->SpikeDamage(amount);

		if (from->hp == 0)
		{
			from->DeathRespawn();
			return WalkWarped;
		}	
	}

	return WalkOK;
}